

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::evaluateConstraint
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraint)

{
  element_type *peVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  ostream *poVar8;
  string *psVar9;
  LinearConstraintImplementation *pLVar10;
  undefined4 extraout_var_00;
  bool isValid;
  iDynTreeEigenConstMatrixMap stateConstraint;
  ostringstream errorMsg;
  char local_201;
  double local_200;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1f8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1d8;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  undefined1 local_1a8 [16];
  variable_if_dynamic<long,__1> local_198;
  PointerType pdStack_190;
  PointerType local_188;
  variable_if_dynamic<long,__1> vStack_180;
  undefined1 local_178;
  
  pLVar10 = this->m_pimpl;
  if (pLVar10->constrainsState == true) {
    local_201 = '\0';
    peVar1 = (pLVar10->stateConstraintMatrix).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_200 = time;
    iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_201);
    if (local_201 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Unable to retrieve a valid state constraint matrix at time: ");
      poVar8 = std::ostream::_M_insert<double>(local_200);
      std::operator<<(poVar8,".");
      psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
      pcVar2 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar2,"evaluateConstraint",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
      goto LAB_001a3ff2;
    }
    lVar4 = iDynTree::MatrixDynSize::cols();
    lVar5 = iDynTree::VectorDynSize::size();
    if (lVar4 == lVar5) {
      sVar6 = iDynTree::MatrixDynSize::rows();
      sVar7 = Constraint::constraintSize(&this->super_Constraint);
      if (sVar6 != sVar7) goto LAB_001a3c54;
    }
    else {
LAB_001a3c54:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator<<((ostream *)local_1a8,"The state constraint matrix at time: ");
      poVar8 = std::ostream::_M_insert<double>(local_200);
      std::operator<<(poVar8,
                      " has dimensions not matching with the specified state space dimension or constraint dimension."
                     );
      psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
      pcVar2 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar2,"evaluateConstraint",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    toEigen(&local_1f8,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
    toEigen(&local_1c0,state);
    local_198.m_value =
         CONCAT71(local_1f8.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value._1_7_,
                  (undefined1)
                  local_1f8.
                  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value);
    local_1a8._0_8_ =
         local_1f8.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data;
    local_1a8._8_8_ =
         local_1f8.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_188 = local_1c0.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    vStack_180.m_value =
         local_1c0.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_178 = local_1c0.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    toEigen(&local_1d8,&this->m_pimpl->stateConstraintsBuffer);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>>
              (&local_1d8,
               (Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)local_1a8);
    pLVar10 = this->m_pimpl;
    time = local_200;
  }
  if (pLVar10->constrainsControl != true) goto LAB_001a3e96;
  local_201 = '\0';
  peVar1 = (pLVar10->controlConstraintMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_200 = time;
  iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_201);
  if (local_201 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "Unable to retrieve a valid control constraint matrix at time: ");
    poVar8 = std::ostream::_M_insert<double>(local_200);
    std::operator<<(poVar8,".");
    psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              (pcVar2,"evaluateConstraint",
               (char *)local_1f8.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data);
LAB_001a3ff2:
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    return false;
  }
  lVar4 = iDynTree::MatrixDynSize::cols();
  lVar5 = iDynTree::VectorDynSize::size();
  if (lVar4 == lVar5) {
    sVar6 = iDynTree::MatrixDynSize::rows();
    sVar7 = Constraint::constraintSize(&this->super_Constraint);
    if (sVar6 != sVar7) goto LAB_001a3daf;
  }
  else {
LAB_001a3daf:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,"The control constraint matrix at time: ");
    poVar8 = std::ostream::_M_insert<double>(local_200);
    std::operator<<(poVar8,
                    " has dimensions not matching with the specified control space dimension or constraint dimension."
                   );
    psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              (pcVar2,"evaluateConstraint",
               (char *)local_1f8.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  toEigen(&local_1f8,(MatrixDynSize *)CONCAT44(extraout_var_00,iVar3));
  toEigen(&local_1c0,control);
  local_198.m_value =
       CONCAT71(local_1f8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value._1_7_,
                (undefined1)
                local_1f8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value);
  local_1a8._0_8_ =
       local_1f8.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_1a8._8_8_ =
       local_1f8.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_188 = local_1c0.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
  vStack_180.m_value =
       local_1c0.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_178 = local_1c0.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_;
  toEigen(&local_1d8,&this->m_pimpl->controlConstraintsBuffer);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>>
            (&local_1d8,
             (Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              *)local_1a8);
LAB_001a3e96:
  Constraint::constraintSize(&this->super_Constraint);
  iDynTree::VectorDynSize::resize((ulong)constraint);
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1f8,
          &this->m_pimpl->stateConstraintsBuffer);
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1c0,
          &this->m_pimpl->controlConstraintsBuffer);
  local_198.m_value._0_1_ =
       (undefined1)
       local_1f8.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_1a8._0_8_ =
       local_1f8.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_1a8._8_8_ =
       local_1f8.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  pdStack_190 = local_1c0.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
  local_188 = (PointerType)
              local_1c0.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value;
  vStack_180.m_value._0_1_ =
       local_1c0.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
       ._16_1_;
  toEigen(&local_1d8,constraint);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
            (&local_1d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_1a8);
  return true;
}

Assistant:

bool LinearConstraint::evaluateConstraint(double time,
                                                  const VectorDynSize& state,
                                                  const VectorDynSize& control,
                                                  VectorDynSize& constraint)
        {
            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }
                iDynTree::iDynTreeEigenConstMatrixMap stateConstraint = iDynTree::toEigen(stateConstraintMatrix);

                iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) = stateConstraint * iDynTree::toEigen(state);
            }


            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }

                iDynTree::iDynTreeEigenConstMatrixMap controlConstraint = iDynTree::toEigen(controlConstraintMatrix);
                iDynTree::toEigen(m_pimpl->controlConstraintsBuffer) = controlConstraint * iDynTree::toEigen(control);
            }

            constraint.resize(static_cast<unsigned int>(constraintSize()));
            toEigen(constraint) = iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) + iDynTree::toEigen(m_pimpl->controlConstraintsBuffer); //the buffers are zero if not constrained

            return true;

        }